

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O0

ssize_t __thiscall
jaegertracing::thrift::AggregationValidator_validateTrace_result::read
          (AggregationValidator_validateTrace_result *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  uint uVar2;
  ssize_t sVar3;
  int16_t *fieldId;
  void *__buf_00;
  undefined4 in_register_00000034;
  short local_4e;
  TType local_4c;
  undefined1 local_48 [2];
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  TProtocol *iprot_local;
  AggregationValidator_validateTrace_result *this_local;
  
  tracker.prot_ = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)&stack0xffffffffffffffe0,tracker.prot_);
  fname.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_48);
  uVar1 = apache::thrift::protocol::TProtocol::readStructBegin(tracker.prot_,(string *)local_48);
  fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
  while( true ) {
    fieldId = &local_4e;
    uVar1 = apache::thrift::protocol::TProtocol::readFieldBegin
                      (tracker.prot_,(string *)local_48,&local_4c,fieldId);
    fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
    if (local_4c == T_STOP) break;
    if (local_4e == 0) {
      if (local_4c == T_STRUCT) {
        sVar3 = ValidateTraceResponse::read
                          (&this->success,(int)tracker.prot_,__buf_00,(size_t)fieldId);
        fname.field_2._12_4_ = (int)sVar3 + fname.field_2._12_4_;
        this->__isset =
             (_AggregationValidator_validateTrace_result__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
    }
    else {
      uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
      fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
    }
    uVar1 = apache::thrift::protocol::TProtocol::readFieldEnd(tracker.prot_);
    fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
  }
  uVar1 = apache::thrift::protocol::TProtocol::readStructEnd(tracker.prot_);
  uVar2 = uVar1 + fname.field_2._12_4_;
  fname.field_2._12_4_ = uVar2;
  std::__cxx11::string::~string((string *)local_48);
  apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
            ((TInputRecursionTracker *)&stack0xffffffffffffffe0);
  return (ulong)uVar2;
}

Assistant:

uint32_t AggregationValidator_validateTrace_result::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 0:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->success.read(iprot);
          this->__isset.success = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}